

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O0

bool __thiscall ProjectGenerator::openOutput(ProjectGenerator *this,QFile *file,QString *build)

{
  bool bVar1;
  byte bVar2;
  QString *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString fileName;
  ProString *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  CaseSensitivity in_stack_fffffffffffffef4;
  QString *in_stack_fffffffffffffef8;
  ProString *file_00;
  MakefileGenerator *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff60;
  QFile *in_stack_ffffffffffffff68;
  MakefileGenerator *in_stack_ffffffffffffff70;
  undefined1 local_50 [24];
  ProString local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file_00 = in_RDI;
  memset(&local_38,0xaa,0x30);
  (**(code **)(*(long *)in_RSI + 0xe8))(local_50);
  ProString::ProString
            ((ProString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             &in_stack_fffffffffffffee8->m_string);
  QString::~QString((QString *)0x1e9044);
  bVar1 = ProString::endsWith(in_RDI,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  if (!bVar1) {
    bVar1 = ProString::isEmpty(&local_38);
    if (bVar1) {
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       &in_stack_fffffffffffffee8->m_string);
      MakefileGenerator::fileInfo(in_stack_ffffffffffffff20,&file_00->m_string);
      QFileInfo::fileName();
      ProString::ProString
                ((ProString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 &in_stack_fffffffffffffee8->m_string);
      ProString::operator=
                ((ProString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      ProString::~ProString((ProString *)0x1e90e9);
      QString::~QString((QString *)0x1e90f6);
      QFileInfo::~QFileInfo((QFileInfo *)&stack0xffffffffffffff60);
      QString::~QString((QString *)0x1e910a);
    }
    ::operator+((ProString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                &in_stack_fffffffffffffee8->m_string);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<ProString_&,_QString_&> *)in_stack_fffffffffffffee8);
    QFile::setFileName(in_RSI);
    QString::~QString((QString *)0x1e915a);
  }
  bVar2 = MakefileGenerator::openOutput
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ProString::~ProString((ProString *)0x1e917f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool
ProjectGenerator::openOutput(QFile &file, const QString &build) const
{
    ProString fileName = file.fileName();
    if (!fileName.endsWith(Option::pro_ext)) {
        if (fileName.isEmpty())
            fileName = fileInfo(Option::output_dir).fileName();
        file.setFileName(fileName + Option::pro_ext);
    }
    return MakefileGenerator::openOutput(file, build);
}